

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

bool __thiscall
caffe::ScaleParameter::MergePartialFromCodedStream(ScaleParameter *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  uint8 *puVar4;
  bool bVar5;
  int length;
  uint32 uVar6;
  int byte_limit;
  FillerParameter *this_00;
  unsigned_long uVar7;
  pair<int,_int> pVar8;
  UnknownFieldSet *unknown_fields;
  char cVar9;
  uint tag;
  ulong uVar10;
  pair<unsigned_long,_bool> pVar11;
  
LAB_00416fb0:
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00416fd4;
      input->buffer_ = pbVar2 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00416fd4:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar10 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar6 | uVar10;
    }
    tag = (uint)uVar10;
    if ((uVar10 & 0x100000000) == 0) goto switchD_00417049_default;
    cVar9 = (char)uVar10;
    switch((uint)(uVar10 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar9 == '\b') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar10 = (ulong)bVar1;
          uVar6 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_004171d8;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar6 = 0;
LAB_004171d8:
          uVar10 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          if ((long)uVar10 < 0) {
            return false;
          }
        }
        this->axis_ = (int32)uVar10;
        goto LAB_00416fb0;
      }
      break;
    case 2:
      if (cVar9 == '\x10') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar10 = (ulong)bVar1;
          uVar6 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_004171f2;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar6 = 0;
LAB_004171f2:
          uVar10 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          if ((long)uVar10 < 0) {
            return false;
          }
        }
        this->num_axes_ = (int32)uVar10;
        goto LAB_00416fb0;
      }
      break;
    case 3:
      if (cVar9 != '\x1a') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      this_00 = this->filler_;
      if (this_00 == (FillerParameter *)0x0) {
        this_00 = (FillerParameter *)operator_new(0x40);
        FillerParameter::FillerParameter(this_00);
        this->filler_ = this_00;
      }
LAB_004170dd:
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (byte_limit = (int)(char)*puVar4, -1 < byte_limit)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (byte_limit < 0) {
          return false;
        }
      }
      pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,byte_limit);
      if ((long)pVar8 < 0) {
        return false;
      }
      bVar5 = FillerParameter::MergePartialFromCodedStream(this_00,input);
      if (!bVar5) {
        return false;
      }
      bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar8.first);
      goto joined_r0x004171a4;
    case 4:
      if (cVar9 == ' ') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) &&
           (uVar7 = (unsigned_long)(char)*puVar4, -1 < (long)uVar7)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          pVar11 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          uVar7 = pVar11.first;
          if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        this->bias_term_ = uVar7 != 0;
        goto LAB_00416fb0;
      }
      break;
    case 5:
      if (cVar9 == '*') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        this_00 = this->bias_filler_;
        if (this_00 == (FillerParameter *)0x0) {
          this_00 = (FillerParameter *)operator_new(0x40);
          FillerParameter::FillerParameter(this_00);
          this->bias_filler_ = this_00;
        }
        goto LAB_004170dd;
      }
    }
switchD_00417049_default:
    if (tag == 0) {
      return true;
    }
    if ((tag & 7) == 4) {
      return true;
    }
    pvVar3 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
    if (((ulong)pvVar3 & 1) == 0) {
      unknown_fields =
           google::protobuf::internal::
           InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ::mutable_unknown_fields_slow
                     (&(this->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     );
    }
    else {
      unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
    }
    bVar5 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
joined_r0x004171a4:
    if (!bVar5) {
      return false;
    }
  } while( true );
}

Assistant:

bool ScaleParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.ScaleParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional int32 axis = 1 [default = 1];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_axis();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &axis_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 num_axes = 2 [default = 1];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_num_axes();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &num_axes_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.FillerParameter filler = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_filler()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool bias_term = 4 [default = false];
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          set_has_bias_term();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &bias_term_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.FillerParameter bias_filler = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias_filler()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.ScaleParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.ScaleParameter)
  return false;
#undef DO_
}